

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldsout.c
# Opt level: O1

uint sysout_loader(char *sysout_file_name,uint sys_size)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  byte bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  __off_t _Var8;
  ssize_t sVar9;
  DLword *pDVar10;
  void *__buf;
  uint *puVar11;
  ulong uVar12;
  ulong extraout_RDX;
  long extraout_RDX_00;
  ulong uVar13;
  stat *psVar14;
  ushort *puVar15;
  ulong in_R8;
  ulong in_R9;
  long lVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  char *pcVar20;
  void *pvVar21;
  long lVar22;
  char *unaff_R15;
  IFPAGE ifpage;
  stat stat_buf;
  uint local_200;
  uint local_1f8;
  undefined1 local_1e8 [18];
  ushort local_1d6;
  ushort local_1d2;
  ushort local_1cc;
  short local_18a;
  ushort local_174;
  uint local_144;
  uint local_13c;
  stat local_138;
  
  if (sys_size - 1 < 7) {
LAB_0012a2d6:
    sysout_loader_cold_14();
LAB_0012a2db:
    sysout_file_name = unaff_R15;
    sysout_loader_cold_13();
LAB_0012a2e0:
    sysout_loader_cold_12();
LAB_0012a2f0:
    sysout_loader_cold_11();
LAB_0012a2f5:
    sysout_loader_cold_10();
LAB_0012a2fa:
    sysout_loader_cold_9();
LAB_0012a304:
    sysout_loader_cold_8();
LAB_0012a30e:
    sysout_loader_cold_7();
  }
  else {
    if (0x100 < sys_size) goto LAB_0012a2db;
    uVar5 = open(sysout_file_name,0);
    if (uVar5 == 0xffffffff) goto LAB_0012a2e0;
    _Var8 = lseek(uVar5,0x200,0);
    if (_Var8 == -1) goto LAB_0012a2f0;
    sVar9 = read(uVar5,local_1e8,0xb0);
    if (sVar9 == -1) goto LAB_0012a2f5;
    word_swap_page(local_1e8,0x2c);
    if (local_1d6 < 0x88c2) goto LAB_0012a2fa;
    if (0x88c2 < local_1d2) goto LAB_0012a304;
    pvVar21 = (void *)(ulong)local_13c;
    uVar17 = 0x40;
    if (local_13c != 0) {
      uVar17 = local_13c;
    }
    if (sys_size != 0) {
      uVar17 = sys_size;
    }
    iVar6 = 1;
    if (((ushort)(local_18a - 3U) < 2) && (iVar6 = 0, local_13c != uVar17)) {
LAB_0012a371:
      puVar11 = &local_13c;
      psVar14 = &local_138;
      sysout_loader_cold_1();
      uVar5 = (uint)pvVar21;
      uVar17 = (uint)INVERT_atom;
      uVar13 = in_R9;
      if (uVar17 == local_200) {
        uVar13 = in_R8;
      }
      uVar7 = (uint)uVar13;
      bVar4 = (byte)in_R8;
      if (uVar17 == local_200) {
        bVar4 = (byte)in_R9;
      }
      if ((lineBlt8::beforecolor0 != bVar4) || (lineBlt8::beforecolor1 != (uchar)uVar13)) {
        lVar22 = 0;
        lineBlt8::beforecolor0 = bVar4;
        lineBlt8::beforecolor1 = (uchar)uVar13;
        do {
          *(uint *)((long)lineBlt8::color_array + lVar22) =
               *(uint *)((long)ConvBM_tbl + lVar22) &
               ((uVar7 & 0xff) * 0x1010101 ^ (uint)bVar4 * 0x1010101) ^ (uint)bVar4 * 0x1010101;
          lVar22 = lVar22 + 4;
        } while (lVar22 != 0x40);
      }
      uVar19 = (uint)puVar11;
      if (REPLACE_atom == local_1f8) {
        uVar17 = uVar5 + 0xf;
        if (-1 < (int)uVar5) {
          uVar17 = uVar5;
        }
        puVar15 = (ushort *)((long)psVar14->__unused + (long)((int)uVar17 >> 4) * 2 + -0x78);
        lVar22 = extraout_RDX_00;
        if (3 < (int)uVar19) {
          do {
            uVar5 = (uint)pvVar21;
            uVar17 = uVar5 + 0xf;
            if (-1 < (int)uVar5) {
              uVar17 = uVar5;
            }
            switch(uVar5 - (uVar17 & 0xfffffff0)) {
            case 0:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(undefined1 *)(lVar22 + lVar16) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 0xc) * 4);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 1:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(undefined1 *)(lVar22 + lVar16) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 9 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 2:
              bVar1 = *(byte *)((long)puVar15 + 1);
              lVar16 = 0;
              do {
                *(undefined1 *)(lVar22 + lVar16) =
                     *(undefined1 *)((long)lineBlt8::color_array + lVar16 + (ulong)(bVar1 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 3:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(undefined1 *)(lVar22 + lVar16) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 7 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 4:
              bVar1 = *(byte *)((long)puVar15 + 1);
              lVar16 = 0;
              do {
                *(undefined1 *)(lVar22 + lVar16) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar16 + (ulong)(bVar1 & 0xf) * 4);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 5:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(undefined1 *)(lVar22 + lVar16) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 5 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 6:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(undefined1 *)(lVar22 + lVar16) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 4 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 7:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(undefined1 *)(lVar22 + lVar16) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 3 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 8:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(undefined1 *)(lVar22 + lVar16) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 2 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 9:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(undefined1 *)(lVar22 + lVar16) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 1 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 10:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(undefined1 *)(lVar22 + lVar16) =
                     *(undefined1 *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 0xb:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(undefined1 *)(lVar22 + lVar16) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 & 0x1e) * 2);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 0xc:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(undefined1 *)(lVar22 + lVar16) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 & 0xf) * 4);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              puVar15 = puVar15 + 1;
              break;
            case 0xd:
              uVar2 = *puVar15;
              uVar3 = puVar15[1];
              puVar15 = puVar15 + 1;
              lVar16 = 0;
              do {
                *(undefined1 *)(lVar22 + lVar16) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array +
                      (ulong)(((ushort)(uVar3 >> 0xf | uVar2 << 1) & 0xf) << 2) + lVar16);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 0xe:
              uVar2 = *puVar15;
              uVar3 = puVar15[1];
              puVar15 = puVar15 + 1;
              lVar16 = 0;
              do {
                *(undefined1 *)(lVar22 + lVar16) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array +
                      (ulong)(((ushort)(uVar3 >> 0xe | uVar2 << 2) & 0xf) << 2) + lVar16);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 0xf:
              uVar2 = *puVar15;
              uVar3 = puVar15[1];
              puVar15 = puVar15 + 1;
              lVar16 = 0;
              do {
                *(undefined1 *)(lVar22 + lVar16) =
                     *(undefined1 *)
                      ((long)lineBlt8::color_array +
                      (ulong)(((ushort)(uVar3 >> 0xd | uVar2 << 3) & 0xf) << 2) + lVar16);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
            }
            iVar6 = (int)puVar11;
            uVar19 = iVar6 - 4;
            lVar22 = lVar22 + 4;
            uVar5 = uVar5 + 4;
            pvVar21 = (void *)(ulong)uVar5;
            puVar11 = (uint *)(ulong)uVar19;
          } while (7 < iVar6);
        }
        if (0xfffffffc < uVar19 - 4) {
          lVar16 = 0;
          uVar7 = uVar7 & 0xff;
          do {
            uVar18 = uVar5 + (int)lVar16;
            uVar17 = uVar5 + 0xf + (int)lVar16;
            if (-1 < (int)uVar18) {
              uVar17 = uVar18;
            }
            iVar6 = uVar18 - (uVar17 & 0xfffffff0);
            uVar17 = (uint)bVar4;
            if ((BitMaskArray[iVar6] & *puVar15) != 0) {
              uVar17 = uVar7;
            }
            *(char *)(lVar22 + lVar16) = (char)uVar17;
            puVar15 = puVar15 + (iVar6 == 0xf);
            lVar16 = lVar16 + 1;
          } while (uVar19 != (uint)lVar16);
        }
      }
      else if (uVar17 == local_1f8) {
        uVar17 = uVar5 + 0xf;
        if (-1 < (int)uVar5) {
          uVar17 = uVar5;
        }
        puVar15 = (ushort *)((long)psVar14->__unused + (long)((int)uVar17 >> 4) * 2 + -0x78);
        lVar22 = extraout_RDX_00;
        if (3 < (int)uVar19) {
          do {
            uVar5 = (uint)pvVar21;
            uVar17 = uVar5 + 0xf;
            if (-1 < (int)uVar5) {
              uVar17 = uVar5;
            }
            switch(uVar5 - (uVar17 & 0xfffffff0)) {
            case 0:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) ^
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 0xc) * 4);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 1:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) ^
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 9 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 2:
              bVar1 = *(byte *)((long)puVar15 + 1);
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) ^
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(bVar1 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 3:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) ^
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 7 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 4:
              bVar1 = *(byte *)((long)puVar15 + 1);
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) ^
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(bVar1 & 0xf) * 4);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 5:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) ^
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 5 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 6:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) ^
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 4 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 7:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) ^
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 3 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 8:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) ^
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 2 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 9:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) ^
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 1 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 10:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) ^
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 0xb:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) ^
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 & 0x1e) * 2);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 0xc:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) ^
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 & 0xf) * 4);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              puVar15 = puVar15 + 1;
              break;
            case 0xd:
              uVar2 = *puVar15;
              uVar3 = puVar15[1];
              puVar15 = puVar15 + 1;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) ^
                     *(byte *)((long)lineBlt8::color_array +
                              (ulong)(((ushort)(uVar3 >> 0xf | uVar2 << 1) & 0xf) << 2) + lVar16);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 0xe:
              uVar2 = *puVar15;
              uVar3 = puVar15[1];
              puVar15 = puVar15 + 1;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) ^
                     *(byte *)((long)lineBlt8::color_array +
                              (ulong)(((ushort)(uVar3 >> 0xe | uVar2 << 2) & 0xf) << 2) + lVar16);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 0xf:
              uVar2 = *puVar15;
              uVar3 = puVar15[1];
              puVar15 = puVar15 + 1;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) ^
                     *(byte *)((long)lineBlt8::color_array +
                              (ulong)(((ushort)(uVar3 >> 0xd | uVar2 << 3) & 0xf) << 2) + lVar16);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
            }
            iVar6 = (int)puVar11;
            uVar19 = iVar6 - 4;
            lVar22 = lVar22 + 4;
            uVar5 = uVar5 + 4;
            pvVar21 = (void *)(ulong)uVar5;
            puVar11 = (uint *)(ulong)uVar19;
          } while (7 < iVar6);
        }
        if (0xfffffffc < uVar19 - 4) {
          lVar16 = 0;
          uVar7 = uVar7 & 0xff;
          do {
            uVar18 = uVar5 + (int)lVar16;
            uVar17 = uVar5 + 0xf + (int)lVar16;
            if (-1 < (int)uVar18) {
              uVar17 = uVar18;
            }
            iVar6 = uVar18 - (uVar17 & 0xfffffff0);
            uVar17 = (uint)bVar4;
            if ((BitMaskArray[iVar6] & *puVar15) != 0) {
              uVar17 = uVar7;
            }
            *(byte *)(lVar22 + lVar16) = *(byte *)(lVar22 + lVar16) ^ (byte)uVar17;
            puVar15 = puVar15 + (iVar6 == 0xf);
            lVar16 = lVar16 + 1;
          } while (uVar19 != (uint)lVar16);
        }
      }
      else if (PAINT_atom == local_1f8) {
        uVar17 = uVar5 + 0xf;
        if (-1 < (int)uVar5) {
          uVar17 = uVar5;
        }
        puVar15 = (ushort *)((long)psVar14->__unused + (long)((int)uVar17 >> 4) * 2 + -0x78);
        lVar22 = extraout_RDX_00;
        if (3 < (int)uVar19) {
          do {
            uVar5 = (uint)pvVar21;
            uVar17 = uVar5 + 0xf;
            if (-1 < (int)uVar5) {
              uVar17 = uVar5;
            }
            switch(uVar5 - (uVar17 & 0xfffffff0)) {
            case 0:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) |
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 0xc) * 4);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 1:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) |
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 9 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 2:
              bVar1 = *(byte *)((long)puVar15 + 1);
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) |
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(bVar1 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 3:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) |
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 7 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 4:
              bVar1 = *(byte *)((long)puVar15 + 1);
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) |
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(bVar1 & 0xf) * 4);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 5:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) |
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 5 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 6:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) |
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 4 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 7:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) |
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 3 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 8:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) |
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 2 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 9:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) |
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 1 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 10:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) |
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 0xb:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) |
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 & 0x1e) * 2);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 0xc:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) |
                     *(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 & 0xf) * 4);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              puVar15 = puVar15 + 1;
              break;
            case 0xd:
              uVar2 = *puVar15;
              uVar3 = puVar15[1];
              puVar15 = puVar15 + 1;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) |
                     *(byte *)((long)lineBlt8::color_array +
                              (ulong)(((ushort)(uVar3 >> 0xf | uVar2 << 1) & 0xf) << 2) + lVar16);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 0xe:
              uVar2 = *puVar15;
              uVar3 = puVar15[1];
              puVar15 = puVar15 + 1;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) |
                     *(byte *)((long)lineBlt8::color_array +
                              (ulong)(((ushort)(uVar3 >> 0xe | uVar2 << 2) & 0xf) << 2) + lVar16);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 0xf:
              uVar2 = *puVar15;
              uVar3 = puVar15[1];
              puVar15 = puVar15 + 1;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) |
                     *(byte *)((long)lineBlt8::color_array +
                              (ulong)(((ushort)(uVar3 >> 0xd | uVar2 << 3) & 0xf) << 2) + lVar16);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
            }
            iVar6 = (int)puVar11;
            uVar19 = iVar6 - 4;
            lVar22 = lVar22 + 4;
            uVar5 = uVar5 + 4;
            pvVar21 = (void *)(ulong)uVar5;
            puVar11 = (uint *)(ulong)uVar19;
          } while (7 < iVar6);
        }
        if (0xfffffffc < uVar19 - 4) {
          lVar16 = 0;
          uVar7 = uVar7 & 0xff;
          do {
            uVar18 = uVar5 + (int)lVar16;
            uVar17 = uVar5 + 0xf + (int)lVar16;
            if (-1 < (int)uVar18) {
              uVar17 = uVar18;
            }
            iVar6 = uVar18 - (uVar17 & 0xfffffff0);
            uVar17 = (uint)bVar4;
            if ((BitMaskArray[iVar6] & *puVar15) != 0) {
              uVar17 = uVar7;
            }
            *(byte *)(lVar22 + lVar16) = *(byte *)(lVar22 + lVar16) | (byte)uVar17;
            puVar15 = puVar15 + (iVar6 == 0xf);
            lVar16 = lVar16 + 1;
          } while (uVar19 != (uint)lVar16);
        }
      }
      else {
        if (ERASE_atom != local_1f8) {
          uVar5 = error("lineBlt8:Illegal operation specified");
          return uVar5;
        }
        uVar17 = uVar5 + 0xf;
        if (-1 < (int)uVar5) {
          uVar17 = uVar5;
        }
        puVar15 = (ushort *)((long)psVar14->__unused + (long)((int)uVar17 >> 4) * 2 + -0x78);
        lVar22 = extraout_RDX_00;
        if (3 < (int)uVar19) {
          do {
            uVar5 = (uint)pvVar21;
            uVar17 = uVar5 + 0xf;
            if (-1 < (int)uVar5) {
              uVar17 = uVar5;
            }
            switch(uVar5 - (uVar17 & 0xfffffff0)) {
            case 0:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 0xc) * 4);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 1:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 9 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 2:
              bVar1 = *(byte *)((long)puVar15 + 1);
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(bVar1 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 3:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 7 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 4:
              bVar1 = *(byte *)((long)puVar15 + 1);
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(bVar1 & 0xf) * 4);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 5:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 5 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 6:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 4 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 7:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 3 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 8:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 2 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 9:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 >> 1 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 10:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 & 0x3c));
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 0xb:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 & 0x1e) * 2);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 0xc:
              uVar2 = *puVar15;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) &
                     ~*(byte *)((long)lineBlt8::color_array + lVar16 + (ulong)(uVar2 & 0xf) * 4);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              puVar15 = puVar15 + 1;
              break;
            case 0xd:
              uVar2 = *puVar15;
              uVar3 = puVar15[1];
              puVar15 = puVar15 + 1;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) &
                     ~*(byte *)((long)lineBlt8::color_array +
                               (ulong)(((ushort)(uVar3 >> 0xf | uVar2 << 1) & 0xf) << 2) + lVar16);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 0xe:
              uVar2 = *puVar15;
              uVar3 = puVar15[1];
              puVar15 = puVar15 + 1;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) &
                     ~*(byte *)((long)lineBlt8::color_array +
                               (ulong)(((ushort)(uVar3 >> 0xe | uVar2 << 2) & 0xf) << 2) + lVar16);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
              break;
            case 0xf:
              uVar2 = *puVar15;
              uVar3 = puVar15[1];
              puVar15 = puVar15 + 1;
              lVar16 = 0;
              do {
                *(byte *)(lVar22 + lVar16) =
                     *(byte *)(lVar22 + lVar16) &
                     ~*(byte *)((long)lineBlt8::color_array +
                               (ulong)(((ushort)(uVar3 >> 0xd | uVar2 << 3) & 0xf) << 2) + lVar16);
                lVar16 = lVar16 + 1;
              } while ((int)lVar16 != 4);
            }
            iVar6 = (int)puVar11;
            uVar19 = iVar6 - 4;
            lVar22 = lVar22 + 4;
            uVar5 = uVar5 + 4;
            pvVar21 = (void *)(ulong)uVar5;
            puVar11 = (uint *)(ulong)uVar19;
          } while (7 < iVar6);
        }
        if (0xfffffffc < uVar19 - 4) {
          lVar16 = 0;
          uVar7 = (uint)(uVar13 & 0xff);
          do {
            uVar18 = uVar5 + (int)lVar16;
            uVar17 = uVar5 + 0xf + (int)lVar16;
            if (-1 < (int)uVar18) {
              uVar17 = uVar18;
            }
            iVar6 = uVar18 - (uVar17 & 0xfffffff0);
            uVar12 = (ulong)bVar4;
            if ((BitMaskArray[iVar6] & *puVar15) != 0) {
              uVar12 = uVar13 & 0xff;
            }
            *(byte *)(lVar22 + lVar16) = *(byte *)(lVar22 + lVar16) & ~(byte)uVar12;
            puVar15 = puVar15 + (iVar6 == 0xf);
            lVar16 = lVar16 + 1;
          } while (uVar19 != (uint)lVar16);
        }
      }
      return uVar7;
    }
    in_R8 = 0xffffffff;
    in_R9 = 0;
    Storage_expanded = iVar6;
    pDVar10 = (DLword *)mmap((void *)0x0,(ulong)(uVar17 << 0x14),3,0x22,-1,0);
    if (pDVar10 == (DLword *)0xffffffffffffffff) goto LAB_0012a30e;
    Lisp_world = pDVar10;
    iVar6 = fstat(uVar5,&local_138);
    if (iVar6 != -1) {
      uVar13 = local_138.st_size + 0x1ff;
      if (-1 < local_138.st_size) {
        uVar13 = local_138.st_size;
      }
      uVar12 = (ulong)local_1cc;
      if (local_1cc == 0x15e3) {
        if ((local_138.st_size & 0x1ffU) != 0) {
          printf("CAUTION::not an integral number of pages.  sysout & 0x1ff = 0x%x\n");
        }
        uVar7 = (uint)((long)uVar13 >> 9);
        uVar19 = uVar7 & 0x7fffffff;
        if (local_144 != uVar19) {
          printf("sysout_loader:IFPAGE says sysout size is %d\n");
          printf("But, sysout size from UNIX is %d\n",(ulong)uVar19);
          exit(-1);
        }
        pvVar21 = (void *)((ulong)local_174 * 0x200 + -0x1fc);
        _Var8 = lseek(uVar5,(__off_t)pvVar21,0);
        if (_Var8 == -1) {
          sysout_loader_cold_5();
        }
        else {
          __buf = malloc((ulong)(uVar7 * 4 + 4));
          pvVar21 = __buf;
          sVar9 = read(uVar5,__buf,(ulong)(uVar7 * 4));
          local_200 = uVar5;
          if (sVar9 != -1) {
            word_swap_page(__buf,uVar19 + 1);
            init_display2(Lisp_world + 0x120000,0x200000);
            if (((long)uVar13 >> 9 & 0x7fffffffU) != 0) {
              unaff_R15 = (char *)(ulong)(uVar7 & 0x7fffffff);
              uVar13 = 0xffffffffffffffff;
              pcVar20 = (char *)0x0;
              do {
                if (*(uint *)((long)__buf + (long)pcVar20 * 4) < 0xffff0000) {
                  uVar12 = (ulong)(uint)((int)pcVar20 << 9);
                  if ((uVar13 == uVar12) ||
                     (_Var8 = lseek(uVar5,uVar12,0), uVar13 = uVar12, _Var8 != -1)) {
                    pvVar21 = (void *)((long)pDVar10 +
                                      (ulong)(uint)(*(int *)((long)__buf + (long)pcVar20 * 4) << 9))
                    ;
                    sVar9 = read(uVar5,pvVar21,0x200);
                    if (sVar9 != -1) {
                      uVar13 = uVar13 + 0x200;
                      word_swap_page(pvVar21,0x80);
                      goto LAB_0012a287;
                    }
                    sysout_loader_cold_3();
                  }
                  sysout_loader_cold_2();
                  goto LAB_0012a2d6;
                }
LAB_0012a287:
                pcVar20 = pcVar20 + 1;
              } while (pcVar20 != unaff_R15);
            }
            free(__buf);
            flush_display_buffer();
            close(uVar5);
            return uVar17;
          }
        }
        sysout_loader_cold_4();
        goto LAB_0012a371;
      }
      goto LAB_0012a31b;
    }
  }
  sysout_loader_cold_6();
  uVar12 = extraout_RDX;
LAB_0012a31b:
  printf("sysout_loader: %s isn\'t a sysout:\nkey is %x, should be %x\n",sysout_file_name,uVar12,
         0x15e3);
  exit(1);
}

Assistant:

unsigned sysout_loader(const char *sysout_file_name, unsigned sys_size) {
  int sysout; /* SysoutFile descriptor */

  IFPAGE ifpage; /* IFPAGE */

#ifdef BIGVM
  /* 1 "cell" per page for 256MB in 512 byte pages */
  unsigned int *fptovp;
#else
  DLword *fptovp; /* FPTOVP */
#endif                /* BIGVM */
  off_t fptovp_offset; /* FPTOVP start offset */

  char *lispworld_scratch; /* scratch area for lispworld */
  size_t lispworld_offset;   /* lispworld offset */

  unsigned sysout_size; /* sysout size in page */
  struct stat stat_buf; /* file stat buf */

  char errmsg[255];
  off_t cfp = -1;  /* tracks current file position in sysout, or -1 */

  /* Checks for specifying the process size (phase I) */
  /* If sys_size == 0 figure out the proper size later */
  if ((sys_size != 0) && (sys_size < DEFAULT_PRIME_SYSOUTSIZE)) {
    perror("You have to specify more than 8MB for process size");
    exit(-1);
  } else if (sys_size > MAX_EXPLICIT_SYSOUTSIZE) {
    perror("256Mb is the maximum legal sysout size.");
    exit(-1);
  }

  /*
   * first read the IFPAGE(InterfacePage)
   */

  /* open SysoutFile */
  sysout = open(sysout_file_name, O_RDONLY);
  if (sysout == -1) {
    sprintf(errmsg, "sysout_loader: can't open sysout file: %s", sysout_file_name);
    perror(errmsg);
    exit(-1);
  }

  /* seek to IFPAGE */
  if (lseek(sysout, IFPAGE_ADDRESS, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to IFPAGE");
    exit(-1);
  }

  /* reads IFPAGE into scratch_page */
  if (read(sysout, &ifpage, sizeof(IFPAGE)) == -1) {
    perror("sysout_loader: can't read IFPAGE");
    exit(-1);
  }

#ifdef BYTESWAP
  word_swap_page((unsigned short *)&ifpage, (3 + sizeof(IFPAGE)) / 4);
#endif

/* Check the sysout and emulator for compatibility:
       The sysout's ifpage.lversion must be >= LVERSION, and
       the sysout's ifpage.minbversion must be <= MINBVERSION
*/
#ifndef NOVERSION
  if (ifpage.lversion < LVERSION) {
    (void)fprintf(stderr, "Lisp VM is too old for this emulator.\n");
    (void)fprintf(stderr, "(version is %d, must be at least %d.)\n", ifpage.lversion, LVERSION);
    exit(-1);
  }

  if (ifpage.minbversion > MINBVERSION) {
    (void)fprintf(stderr, "Emulator is too old for this Lisp VM.\n");
    (void)fprintf(stderr, "(version is %d, must be at least %d.)\n", MINBVERSION, ifpage.minbversion);
    exit(-1);
  }
#endif /* NOVERSION */

  /* use default or the previous one */
  if (sys_size == 0) {
    if (ifpage.process_size == 0)        /* Pure LISP.SYSOUT */
      sys_size = DEFAULT_MAX_SYSOUTSIZE; /* default for pure SYSOUT */
    else
      sys_size = ifpage.process_size; /* use previous one */
  }

  /* Checks for specifying the process size (phase II) */
  if ((ifpage.storagefullstate == SFS_ARRAYSWITCHED) ||
      (ifpage.storagefullstate == SFS_FULLYSWITCHED)) {
    /* Storage may be allocated from Secondary space */
    /* Therefore you can not change \\DefaultSecondMDSPage */
    if (ifpage.process_size != sys_size) {
      char tmp[200];
      sprintf(tmp,
              "\nsysout loader: Error, secondary space in use. You can't specify size.\nProcess "
              "size = %d\nSys size = %d\n",
              ifpage.process_size, sys_size);
#ifdef DOS
      /* Note that we have an initialized display by now. */
      /* Hence we have to observe the display protocol. */
      VESA_errorexit(tmp);
#else
      (void)fprintf(stderr, "sysout_loader: You can't specify the process size.\n");
      (void)fprintf(stderr, "Because, secondary space is already used.\n");
      (void)fprintf(stderr, "(size is %d, you specified %d.)\n", ifpage.process_size, sys_size);
      exit(-1);
#endif /* DOS */
    }
    /*Can use this sys_size as the process size */
    /* The sys_size should be same as the previous one */
    Storage_expanded = NIL;
  } else { /* assumes that we can expand the process space */
    Storage_expanded = T;
    /* You can use secondary space , though it was STORAGEFULL
       So, STORAGEFULL may be set to NIL later  */
  }

  /* allocate Virtual Memory Space */

  lispworld_scratch = mmap(0, sys_size * MBYTE, PROT_READ|PROT_WRITE, MAP_ANON | MAP_PRIVATE, -1, 0);
  if (lispworld_scratch == MAP_FAILED) {
    (void)fprintf(stderr, "sysout_loader: can't allocate Lisp %dMBytes VM \n", sys_size);
    exit(-1);
  }

  /* now you can access lispworld */
  Lisp_world = (DLword *)lispworld_scratch;

  DBPRINT(("VM allocated = 0x%x at %p\n", sys_size * MBYTE, (void *)Lisp_world));
  DBPRINT(("Native Load Address = 0x%x\n", native_load_address));

  /*
   * get FPTOVP location and SysoutFile size
   */

  /* get FPTOVP location from IFPAGE */
  fptovp_offset = ifpage.fptovpstart;

  DBPRINT(("FPTOVP Location %ld \n", (long)fptovp_offset));

  /* get sysout file size in halfpage(256) */
  if (fstat(sysout, &stat_buf) == -1) {
    perror("sysout_loader: can't get sysout file size");
    exit(-1);
  }
  sysout_size = (unsigned)(stat_buf.st_size / BYTESPER_PAGE * 2);

  DBPRINT(("sysout size / 2 = 0x%x\n", sysout_size / 2));
  DBPRINT(("vmem size = 0x%x\n", ifpage.nactivepages));

  /* do some simple checks to see if this is really a sysout */
  if (ifpage.key != IFPAGE_KEYVAL) {
    printf("sysout_loader: %s isn't a sysout:\nkey is %x, should be %x\n", sysout_file_name,
           ifpage.key, IFPAGE_KEYVAL);
    exit(1);
  }

  if ((stat_buf.st_size & (BYTESPER_PAGE - 1)) != 0)
    printf("CAUTION::not an integral number of pages.  sysout & 0x1ff = 0x%x\n",
           (int)(stat_buf.st_size & (BYTESPER_PAGE - 1)));

  if (ifpage.nactivepages != (sysout_size / 2)) {
    printf("sysout_loader:IFPAGE says sysout size is %d\n", ifpage.nactivepages);
    printf("But, sysout size from UNIX is %d\n", sysout_size / 2);
    exit(-1);
  }

/*
 * Now get FPTOVP
 */

/* seek to FPTOVP */
#ifdef BIGVM
  fptovp_offset = (fptovp_offset - 1) * BYTESPER_PAGE + 4;
#else
  fptovp_offset = (fptovp_offset - 1) * BYTESPER_PAGE + 2;
#endif
  if (lseek(sysout, fptovp_offset, SEEK_SET) == -1) {
    perror("sysout_loader: can't seek to FPTOVP");
    exit(-1);
  }

  /* read FPTOVP */

#ifdef BIGVM
  /* fptovp is now in cells, not words */
  fptovp = malloc(sysout_size * 2 + 4);
  if (read(sysout, fptovp, sysout_size * 2) == -1) {
    perror("sysout_loader: can't read FPTOVP");
    free(fptovp);
    exit(-1);
  }

#ifdef BYTESWAP
  /* So space to swap is twice as big, too. */
  word_swap_page((unsigned short *)fptovp, (sysout_size / 2) + 1);
#endif /* BYTESWAP */

#else

  fptovp = malloc(sysout_size + 2);
  if (read(sysout, fptovp, sysout_size) == -1) {
    perror("sysout_loader: can't read FPTOVP");
    free(fptovp);
    exit(-1);
  }

#ifdef BYTESWAP
  word_swap_page((unsigned short *)fptovp, (sysout_size / 4) + 1);
#endif /* BYTESWAP */

#endif /* BIGVM */

  /*
   * Initialize the display (note now passing 68k address!!!)
   */
  init_display2(NativeAligned2FromLAddr(DISPLAY_OFFSET), 65536 * 16 * 2);

  /* read sysout file to lispworld */

  for (unsigned i = 0; i < (sysout_size / 2); i++) {
#ifdef DOS
    /* Dial that floats from left to right on the top line of the */
    /* displaty. Dial shows % of sysout loaded by digits and */
    /* position. */
    int columns;
    switch (currentdsp->graphicsmode) {
      case 0x104:
        columns = 120; /* 131 - 10 */
        break;
      case 0x102:
        columns = 69; /* 79 - 10 */
        break;
      default:
        columns = 69; /* 79 - 10 */
        break;
    }
    _settextposition((short)0, (short)0);
    if ((i & 0xf) == 0) {
      for (int j = 0; j < (columns * i) / (sysout_size >> 1); j++) putchar(' ');
      printf("-=(%2d%%)=-\n", (100 * i) / (sysout_size >> 1));
    }
#endif /* DOS */
    if (GETPAGEOK(fptovp, i) != 0177777) {
      /* only seek if not already at desired position */
      if (i * BYTESPER_PAGE != cfp) {
	if (lseek(sysout, i * BYTESPER_PAGE, SEEK_SET) == -1) {
	  perror("sysout_loader: can't seek sysout file");
	  free(fptovp);
	  exit(-1);
	}
	cfp = i * BYTESPER_PAGE; /* now at known position */
      }
      lispworld_offset = GETFPTOVP(fptovp, i) * BYTESPER_PAGE;
      if (read(sysout, lispworld_scratch + lispworld_offset, BYTESPER_PAGE) == -1) {
        printf("sysout_loader: can't read sysout file at %d\n", i);
        printf("               offset was 0x%zx (0x%x pages).\n", lispworld_offset,
               GETFPTOVP(fptovp, i));
        perror("read() error was");
        for (int j = 0; j < 10; j++) {
          printf(" %d: 0x%x  ", j, GETFPTOVP(fptovp, j));
        }
        free(fptovp);
        exit(-1);
      }
      cfp += BYTESPER_PAGE; /* new known position */
#ifdef BYTESWAP
      word_swap_page((DLword *)(lispworld_scratch + lispworld_offset), 128);
#endif
    }
  }
  free(fptovp);
  DBPRINT(("sysout file is read completely.\n"));

#if (defined(DISPLAYBUFFER) || defined(XWINDOW) || defined(DOS))
  TPRINT(("Flushing display buffer...\n"));
  flush_display_buffer();
  TPRINT(("After Flushing display buffer\n"));
#endif /* DISPLAYBUFFER || XWINDOW || DOS */

  close(sysout);
  return (sys_size);
}